

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O2

void dfsfast_preorder(Abc_Ntk_t *pNtk)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  int *piVar6;
  Abc_Obj_t *pAVar7;
  void *pvVar8;
  Vec_Ptr_t *pVVar9;
  long *Entry;
  Flow_Data_t *pFVar10;
  int Addition;
  int Addition_00;
  int iVar11;
  int iVar12;
  long lVar13;
  char *__assertion;
  uint uVar14;
  uint uVar15;
  int iStack_60;
  
  p = Vec_PtrAlloc(pNtk->nObjs);
  iVar12 = pNtk->nObjs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar12 - 1U) {
    iVar11 = iVar12;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar11;
  if (iVar11 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar11 << 2);
  }
  p_00->pArray = piVar6;
  if (pManMR->maxDelay != 0) {
    for (iVar12 = 0; iVar12 < pNtk->vObjs->nSize; iVar12 = iVar12 + 1) {
      pAVar7 = Abc_NtkObj(pNtk,iVar12);
      if (pAVar7 != (Abc_Obj_t *)0x0) {
        iVar11 = 0;
        while( true ) {
          if (pManMR->vTimeEdges[(uint)pAVar7->Id].nSize <= iVar11) break;
          pvVar8 = Vec_PtrEntry(pManMR->vTimeEdges + (uint)pAVar7->Id,iVar11);
          pVVar9 = pManMR->pDataArray[*(uint *)((long)pvVar8 + 0x10)].field_1.vNodes;
          if (pVVar9 == (Vec_Ptr_t *)0x0) {
            pVVar9 = Vec_PtrAlloc(2);
            pManMR->pDataArray[*(uint *)((long)pvVar8 + 0x10)].field_1.vNodes = pVVar9;
          }
          Vec_PtrPush(pVVar9,pAVar7);
          iVar11 = iVar11 + 1;
        }
      }
    }
  }
  pVVar4 = pManMR->vSinkDistHist;
  if (pVVar4 == (Vec_Int_t *)0x0) {
    __assertion = "pManMR->vSinkDistHist";
    uVar15 = 0x4d;
  }
  else {
    memset(pVVar4->pArray,0,(long)pVVar4->nSize << 2);
    for (iVar12 = 0; iVar12 < pNtk->vObjs->nSize; iVar12 = iVar12 + 1) {
      pAVar7 = Abc_NtkObj(pNtk,iVar12);
      if (pAVar7 != (Abc_Obj_t *)0x0) {
        uVar5 = *(uint *)&pAVar7->field_0x14 & 0xf;
        uVar15 = 0x10000;
        uVar14 = 0xffff;
        if ((uVar5 == 3) || (uVar5 == 8)) {
          iStack_60 = 0x72;
        }
        else if (pManMR->fIsForward == 0) {
          uVar14 = 0xffff0000;
          if (uVar5 == 2) {
            iStack_60 = 0x65;
            uVar15 = 1;
          }
          else {
            iStack_60 = 0x65;
            uVar15 = 1;
            if ((*(uint *)(pManMR->pDataArray + (uint)pAVar7->Id) & pManMR->constraintMask & 0x90)
                == 0) goto LAB_0040f850;
          }
        }
        else {
          iStack_60 = 0x72;
          if ((*(uint *)(pManMR->pDataArray + (uint)pAVar7->Id) & pManMR->constraintMask & 0x90) ==
              0) {
            uVar14 = 0xffff0000;
            iStack_60 = 0x65;
            uVar15 = 1;
            if (uVar5 != 2) goto LAB_0040f850;
          }
        }
        Vec_PtrPush(p,pAVar7);
        Vec_IntPush(p_00,iStack_60);
        *(uint *)&pManMR->pDataArray[(uint)pAVar7->Id].field_0x10 =
             uVar14 & *(uint *)&pManMR->pDataArray[(uint)pAVar7->Id].field_0x10 | uVar15;
      }
LAB_0040f850:
    }
    lVar13 = 0;
    while( true ) {
      if (p->nSize <= lVar13) {
        if (pManMR->maxDelay != 0) {
          for (iVar12 = 0; iVar12 < pNtk->vObjs->nSize; iVar12 = iVar12 + 1) {
            pAVar7 = Abc_NtkObj(pNtk,iVar12);
            if ((pAVar7 != (Abc_Obj_t *)0x0) &&
               (pVVar9 = pManMR->pDataArray[(uint)pAVar7->Id].field_1.vNodes,
               pVVar9 != (Vec_Ptr_t *)0x0)) {
              Vec_PtrFree(pVVar9);
              pManMR->pDataArray[(uint)pAVar7->Id].field_1.pred = (Abc_Obj_t *)0x0;
            }
          }
        }
        for (iVar12 = 0; iVar12 < pNtk->vObjs->nSize; iVar12 = iVar12 + 1) {
          pAVar7 = Abc_NtkObj(pNtk,iVar12);
          if (pAVar7 != (Abc_Obj_t *)0x0) {
            Vec_IntAddToEntry(pManMR->vSinkDistHist,
                              (uint)*(ushort *)&pManMR->pDataArray[(uint)pAVar7->Id].field_0x12,
                              Addition);
            Vec_IntAddToEntry(pManMR->vSinkDistHist,
                              (uint)*(ushort *)&pManMR->pDataArray[(uint)pAVar7->Id].field_0x10,
                              Addition_00);
          }
        }
        Vec_PtrFree(p);
        free(p_00->pArray);
        free(p_00);
        return;
      }
      Entry = (long *)Vec_PtrEntry(p,(int)lVar13);
      if (Entry == (long *)0x0) break;
      if (p_00->nSize <= lVar13) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar1 = lVar13 + 1;
      if (p_00->pArray[lVar13] == 0x72) {
        uVar15 = *(uint *)&pManMR->pDataArray[*(uint *)(Entry + 2)].field_0x10;
        uVar5 = uVar15 >> 0x10;
        uVar14 = uVar5 + 1 & 0xffff;
        if (pManMR->fIsForward == 0) {
          for (lVar13 = 0; lVar13 < *(int *)((long)Entry + 0x2c); lVar13 = lVar13 + 1) {
            pvVar8 = *(void **)(*(long *)(*(long *)(*Entry + 0x20) + 8) +
                               (long)*(int *)(Entry[6] + lVar13 * 4) * 8);
            uVar2 = *(uint *)((long)pvVar8 + 0x10);
            uVar3 = *(uint *)&pManMR->pDataArray[uVar2].field_0x10;
            if ((short)uVar3 == 0) {
              *(uint *)&pManMR->pDataArray[uVar2].field_0x10 = uVar3 | uVar14;
              Vec_PtrPush(p,pvVar8);
              Vec_IntPush(p_00,0x65);
            }
          }
        }
        else {
          for (lVar13 = 0; lVar13 < *(int *)((long)Entry + 0x1c); lVar13 = lVar13 + 1) {
            pvVar8 = *(void **)(*(long *)(*(long *)(*Entry + 0x20) + 8) +
                               (long)*(int *)(Entry[4] + lVar13 * 4) * 8);
            uVar2 = *(uint *)((long)pvVar8 + 0x10);
            uVar3 = *(uint *)&pManMR->pDataArray[uVar2].field_0x10;
            if ((short)uVar3 == 0) {
              *(uint *)&pManMR->pDataArray[uVar2].field_0x10 = uVar3 | uVar14;
              Vec_PtrPush(p,pvVar8);
              Vec_IntPush(p_00,0x65);
            }
          }
        }
        lVar13 = lVar1;
        if ((uVar5 != 1) && (pManMR->fIsForward != 0)) {
          uVar15 = (uVar15 & 0xffff0000) + 0x10000;
          for (lVar13 = 0; lVar13 < *(int *)((long)Entry + 0x2c); lVar13 = lVar13 + 1) {
            pvVar8 = *(void **)(*(long *)(*(long *)(*Entry + 0x20) + 8) +
                               (long)*(int *)(Entry[6] + lVar13 * 4) * 8);
            uVar5 = *(uint *)&pManMR->pDataArray[*(uint *)((long)pvVar8 + 0x10)].field_0x10;
            if ((uVar5 < 0x10000) && ((*(uint *)((long)pvVar8 + 0x14) & 0xf) != 8)) {
              *(uint *)&pManMR->pDataArray[*(uint *)((long)pvVar8 + 0x10)].field_0x10 =
                   uVar5 | uVar15;
              Vec_PtrPush(p,pvVar8);
              Vec_IntPush(p_00,0x72);
            }
          }
          lVar13 = lVar1;
          if ((pManMR->maxDelay != 0) &&
             (pVVar9 = pManMR->pDataArray[*(uint *)(Entry + 2)].field_1.vNodes,
             pVVar9 != (Vec_Ptr_t *)0x0)) {
            for (iVar12 = 0; iVar12 < pVVar9->nSize; iVar12 = iVar12 + 1) {
              pvVar8 = Vec_PtrEntry(pVVar9,iVar12);
              pFVar10 = pManMR->pDataArray;
              if (*(uint *)&pFVar10[*(uint *)((long)pvVar8 + 0x10)].field_0x10 < 0x10000) {
                *(uint *)&pFVar10[*(uint *)((long)pvVar8 + 0x10)].field_0x10 =
                     *(uint *)&pFVar10[*(uint *)((long)pvVar8 + 0x10)].field_0x10 | uVar15;
                Vec_PtrPush(p,pvVar8);
                Vec_IntPush(p_00,0x72);
                pFVar10 = pManMR->pDataArray;
              }
              pVVar9 = pFVar10[*(uint *)(Entry + 2)].field_1.vNodes;
            }
          }
        }
      }
      else {
        lVar13 = lVar1;
        if ((*(uint *)((long)Entry + 0x14) & 0xf) != 8) {
          uVar15 = *(uint *)&pManMR->pDataArray[*(uint *)(Entry + 2)].field_0x10;
          if (uVar15 < 0x10000) {
            *(uint *)&pManMR->pDataArray[*(uint *)(Entry + 2)].field_0x10 =
                 uVar15 * 0x10001 + 0x10000;
            Vec_PtrPush(p,Entry);
            Vec_IntPush(p_00,0x72);
          }
          if (pManMR->fIsForward == 0) {
            uVar15 = uVar15 + 1 & 0xffff;
            for (lVar13 = 0; lVar13 < *(int *)((long)Entry + 0x1c); lVar13 = lVar13 + 1) {
              pvVar8 = *(void **)(*(long *)(*(long *)(*Entry + 0x20) + 8) +
                                 (long)*(int *)(Entry[4] + lVar13 * 4) * 8);
              uVar5 = *(uint *)&pManMR->pDataArray[*(uint *)((long)pvVar8 + 0x10)].field_0x10;
              if (((short)uVar5 == 0) && ((*(uint *)((long)pvVar8 + 0x14) & 0xf) != 8)) {
                *(uint *)&pManMR->pDataArray[*(uint *)((long)pvVar8 + 0x10)].field_0x10 =
                     uVar5 | uVar15;
                Vec_PtrPush(p,pvVar8);
                Vec_IntPush(p_00,0x65);
              }
            }
            lVar13 = lVar1;
            if ((pManMR->maxDelay != 0) &&
               (pVVar9 = pManMR->pDataArray[*(uint *)(Entry + 2)].field_1.vNodes,
               pVVar9 != (Vec_Ptr_t *)0x0)) {
              for (iVar12 = 0; iVar12 < pVVar9->nSize; iVar12 = iVar12 + 1) {
                pvVar8 = Vec_PtrEntry(pVVar9,iVar12);
                pFVar10 = pManMR->pDataArray;
                if ((short)*(uint *)&pFVar10[*(uint *)((long)pvVar8 + 0x10)].field_0x10 == 0) {
                  *(uint *)&pFVar10[*(uint *)((long)pvVar8 + 0x10)].field_0x10 =
                       *(uint *)&pFVar10[*(uint *)((long)pvVar8 + 0x10)].field_0x10 | uVar15;
                  Vec_PtrPush(p,pvVar8);
                  Vec_IntPush(p_00,0x65);
                  pFVar10 = pManMR->pDataArray;
                }
                pVVar9 = pFVar10[*(uint *)(Entry + 2)].field_1.vNodes;
              }
            }
          }
        }
      }
    }
    __assertion = "pObj";
    uVar15 = 0x62;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretFlow.c"
                ,uVar15,"void dfsfast_preorder(Abc_Ntk_t *)");
}

Assistant:

void dfsfast_preorder( Abc_Ntk_t *pNtk ) {
  Abc_Obj_t *pObj, *pNext;
  Vec_Ptr_t *vTimeIn, *qn = Vec_PtrAlloc(Abc_NtkObjNum(pNtk));
  Vec_Int_t *qe = Vec_IntAlloc(Abc_NtkObjNum(pNtk));
  int i, j, d = 0, end;
  int qpos = 0;

  // create reverse timing edges for backward traversal
#if !defined(IGNORE_TIMING)
  if (pManMR->maxDelay) {
    Abc_NtkForEachObj( pNtk, pObj, i ) {
      Vec_PtrForEachEntry( Abc_Obj_t *, FTIMEEDGES(pObj), pNext, j ) {
        vTimeIn = FDATA(pNext)->vNodes;
        if (!vTimeIn) {
          vTimeIn = FDATA(pNext)->vNodes = Vec_PtrAlloc(2);
        }
        Vec_PtrPush(vTimeIn, pObj);
      }
    }
  }
#endif

  // clear histogram
  assert(pManMR->vSinkDistHist);
  memset(Vec_IntArray(pManMR->vSinkDistHist), 0, sizeof(int)*Vec_IntSize(pManMR->vSinkDistHist));

  // seed queue : latches, PIOs, and blocks
  Abc_NtkForEachObj( pNtk, pObj, i )
    if (Abc_ObjIsPo(pObj) ||
        Abc_ObjIsLatch(pObj) || 
        (pManMR->fIsForward && FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask)) {
      Vec_PtrPush(qn, pObj);
      Vec_IntPush(qe, 'r');
      FDATA(pObj)->r_dist = 1;
    } else if (Abc_ObjIsPi(pObj) || 
               (!pManMR->fIsForward && FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask)) {
      Vec_PtrPush(qn, pObj);
      Vec_IntPush(qe, 'e');
      FDATA(pObj)->e_dist = 1;
    }

  // until queue is empty...
  while(qpos < Vec_PtrSize(qn)) {
    pObj = (Abc_Obj_t *)Vec_PtrEntry(qn, qpos);
    assert(pObj);
    end = Vec_IntEntry(qe, qpos);
    qpos++;
    
    if (end == 'r') {
      d = FDATA(pObj)->r_dist;

      // 1. structural edges
      if (pManMR->fIsForward) {
        Abc_ObjForEachFanin( pObj, pNext, i )
          if (!FDATA(pNext)->e_dist) {
            FDATA(pNext)->e_dist = d+1;
            Vec_PtrPush(qn, pNext);
            Vec_IntPush(qe, 'e');
          }
      } else
        Abc_ObjForEachFanout( pObj, pNext, i )
          if (!FDATA(pNext)->e_dist) {
            FDATA(pNext)->e_dist = d+1;
            Vec_PtrPush(qn, pNext);
            Vec_IntPush(qe, 'e');
          }

      if (d == 1) continue;

      // 2. reverse edges (forward retiming only)
      if (pManMR->fIsForward) {
        Abc_ObjForEachFanout( pObj, pNext, i )
          if (!FDATA(pNext)->r_dist && !Abc_ObjIsLatch(pNext)) {
            FDATA(pNext)->r_dist = d+1;
            Vec_PtrPush(qn, pNext);
            Vec_IntPush(qe, 'r');
          }          

      // 3. timimg edges (forward retiming only)
#if !defined(IGNORE_TIMING)
        if (pManMR->maxDelay && FDATA(pObj)->vNodes)
          Vec_PtrForEachEntry(Abc_Obj_t *, FDATA(pObj)->vNodes, pNext, i ) {
            if (!FDATA(pNext)->r_dist) {
              FDATA(pNext)->r_dist = d+1;
              Vec_PtrPush(qn, pNext);
              Vec_IntPush(qe, 'r');
            }
          }
#endif
      }
      
    } else { // if 'e'
      if (Abc_ObjIsLatch(pObj)) continue;

      d = FDATA(pObj)->e_dist;

      // 1. through node
      if (!FDATA(pObj)->r_dist) {
        FDATA(pObj)->r_dist = d+1;
        Vec_PtrPush(qn, pObj);
        Vec_IntPush(qe, 'r');
      }

      // 2. reverse edges (backward retiming only)
      if (!pManMR->fIsForward) {
        Abc_ObjForEachFanin( pObj, pNext, i )
          if (!FDATA(pNext)->e_dist && !Abc_ObjIsLatch(pNext)) {
            FDATA(pNext)->e_dist = d+1;
            Vec_PtrPush(qn, pNext);
            Vec_IntPush(qe, 'e');
          }  

      // 3. timimg edges (backward retiming only)
#if !defined(IGNORE_TIMING)
        if (pManMR->maxDelay && FDATA(pObj)->vNodes)
          Vec_PtrForEachEntry(Abc_Obj_t *, FDATA(pObj)->vNodes, pNext, i ) {
            if (!FDATA(pNext)->e_dist) {
              FDATA(pNext)->e_dist = d+1;
              Vec_PtrPush(qn, pNext);
              Vec_IntPush(qe, 'e');
            }
          }
#endif
      }
    }
  }
 
  // free time edges
#if !defined(IGNORE_TIMING)
  if (pManMR->maxDelay) {
    Abc_NtkForEachObj( pNtk, pObj, i ) {
      vTimeIn = FDATA(pObj)->vNodes;
      if (vTimeIn) {
        Vec_PtrFree(vTimeIn);
        FDATA(pObj)->vNodes = 0;
      }
    }
  }
#endif

  Abc_NtkForEachObj( pNtk, pObj, i ) {
    Vec_IntAddToEntry(pManMR->vSinkDistHist, FDATA(pObj)->r_dist, 1);
    Vec_IntAddToEntry(pManMR->vSinkDistHist, FDATA(pObj)->e_dist, 1);

#ifdef DEBUG_PREORDER
    printf("node %d\t: r=%d\te=%d\n", Abc_ObjId(pObj), FDATA(pObj)->r_dist, FDATA(pObj)->e_dist);
#endif
  }

  // printf("\t\tpre-ordered (max depth=%d)\n", d+1);

  // deallocate
  Vec_PtrFree( qn );
  Vec_IntFree( qe );
}